

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall glcts::LayoutBindingBaseCase::maxBindings(LayoutBindingBaseCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  Functions *pFVar2;
  GLint local_14;
  LayoutBindingBaseCase *pLStack_10;
  int units;
  LayoutBindingBaseCase *this_local;
  
  local_14 = 0;
  pLStack_10 = this;
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  if (*(int *)(CONCAT44(extraout_var,iVar1) + 8) == 2) {
    pFVar2 = gl(this);
    (*pFVar2->getIntegerv)(0x8f38,&local_14);
  }
  else {
    pFVar2 = gl(this);
    (*pFVar2->getIntegerv)(0x8b4d,&local_14);
  }
  return local_14;
}

Assistant:

virtual int maxBindings()
	{
		int units = 0;

		if (getTestParameters().surface_type == Image)
		{
			gl().getIntegerv(GL_MAX_IMAGE_UNITS, &units);
		}
		else
		{
			gl().getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &units);
		}

		return units;
	}